

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

Table * __thiscall luna::State::GetMetatable(State *this,char *metatable_name)

{
  State *this_00;
  anon_union_8_9_8deb4486_for_Value_0 aVar1;
  Value VVar2;
  Value metatable;
  Table *metatables;
  Value k;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Value *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  ValueT VVar3;
  undefined4 in_stack_ffffffffffffffd4;
  
  Value::Value((Value *)&stack0xffffffffffffffe0);
  this_00 = (State *)GetString((State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                ),in_stack_ffffffffffffffb8);
  GetMetatables(this_00);
  VVar2 = Table::GetValue((Table *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
  aVar1 = VVar2.field_0;
  VVar3 = VVar2.type_;
  if (VVar3 == ValueT_Nil) {
    VVar3 = ValueT_Table;
    aVar1.table_ = NewTable((State *)0x1ef791);
    Table::SetValue(metatables,(Value *)metatable._8_8_,(Value *)metatable.field_0.obj_);
  }
  if (VVar3 == ValueT_Table) {
    return (Table *)aVar1.obj_;
  }
  __assert_fail("metatable.type_ == ValueT_Table",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/State.cpp",
                0xce,"Table *luna::State::GetMetatable(const char *)");
}

Assistant:

Table * State::GetMetatable(const char *metatable_name)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = GetString(metatable_name);

        auto metatables = GetMetatables();
        auto metatable = metatables->GetValue(k);

        // Create table when metatable not existed
        if (metatable.type_ == ValueT_Nil)
        {
            metatable.type_ = ValueT_Table;
            metatable.table_ = NewTable();
            metatables->SetValue(k, metatable);
        }

        assert(metatable.type_ == ValueT_Table);
        return metatable.table_;
    }